

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

void anm_replace(anm_archive_t *anm,FILE *anmfp,char *name,char *filename)

{
  ushort uVar1;
  ushort uVar2;
  long *plVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  image_t *__ptr;
  uchar *__ptr_00;
  long lVar13;
  format_t format;
  long lVar14;
  uint uVar15;
  list_node_t *plVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint height;
  uint width;
  
  width = 0;
  height = 0;
  util_total_entry_size(anm,name,&width,&height);
  uVar6 = width;
  uVar5 = height;
  uVar18 = (ulong)width;
  uVar19 = (ulong)height;
  if (height == 0 || width == 0) {
    return;
  }
  __ptr = png_read(filename);
  if ((uVar6 == __ptr->width) && (uVar5 == __ptr->height)) {
    lVar13 = 0;
    do {
      if (lVar13 == 5) {
        free(__ptr->data);
        free(__ptr);
        return;
      }
      lVar14 = 0;
      plVar16 = (list_node_t *)&anm->entries;
      while (plVar16 = plVar16->next, plVar16 != (list_node_t *)0x0) {
        plVar3 = (long *)plVar16->data;
        if ((char *)plVar3[2] == name) {
          format = (format_t)*(ushort *)(plVar3[1] + 6);
          if (((&DAT_0012b070)[lVar13] == format) && (*(short *)(*plVar3 + 0x34) != 0)) {
            __ptr_00 = format_from_rgba((uint32_t *)__ptr->data,uVar5 * uVar6,
                                        (uint)*(ushort *)(plVar3[1] + 6));
            uVar15 = *(uint *)(*plVar3 + 0x24);
            if (anmfp == (FILE *)0x0) {
              iVar17 = uVar6 * uVar15;
              for (uVar9 = uVar15; uVar9 < *(ushort *)(plVar3[1] + 10) + uVar15; uVar9 = uVar9 + 1)
              {
                lVar4 = plVar3[8];
                uVar1 = *(ushort *)(plVar3[1] + 8);
                uVar7 = format_Bpp(format);
                uVar10 = format_Bpp(format);
                iVar8 = *(int *)(*plVar3 + 0x20);
                uVar11 = format_Bpp(format);
                uVar2 = *(ushort *)(plVar3[1] + 8);
                uVar12 = format_Bpp(format);
                memcpy((void *)((ulong)((uVar9 - uVar15) * uVar7 * (uint)uVar1) + lVar4),
                       __ptr_00 + (ulong)(uVar11 * iVar8) + (ulong)(uVar10 * iVar17),
                       (ulong)(uVar2 * uVar12));
                uVar15 = *(uint *)(*plVar3 + 0x24);
                iVar17 = iVar17 + uVar6;
              }
            }
            else {
              iVar17 = uVar6 * uVar15;
              while( true ) {
                iVar8 = *(int *)(*plVar3 + 0x24);
                if ((uint)*(ushort *)(plVar3[1] + 10) + iVar8 <= uVar15) break;
                uVar9 = *(uint *)(*plVar3 + 0x30);
                uVar1 = *(ushort *)(plVar3[1] + 8);
                uVar7 = format_Bpp(format);
                iVar8 = file_seek(anmfp,(ulong)(uVar1 * uVar7 * (uVar15 - iVar8)) +
                                        (ulong)uVar9 + lVar14 + 0x10);
                if (iVar8 == 0) goto LAB_001062fc;
                uVar9 = format_Bpp(format);
                iVar8 = *(int *)(*plVar3 + 0x20);
                uVar7 = format_Bpp(format);
                uVar1 = *(ushort *)(plVar3[1] + 8);
                uVar10 = format_Bpp(format);
                iVar8 = file_write(anmfp,__ptr_00 + (ulong)(uVar7 * iVar8) + (ulong)(uVar9 * iVar17)
                                   ,(ulong)(uVar1 * uVar10));
                uVar15 = uVar15 + 1;
                iVar17 = iVar17 + uVar6;
                if (iVar8 == 0) goto LAB_001062fc;
              }
            }
            free(__ptr_00);
          }
        }
        lVar14 = lVar14 + (ulong)*(uint *)(*plVar3 + 0x38);
      }
      lVar13 = lVar13 + 1;
    } while( true );
  }
  fprintf(_stderr,"%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",argv0,
          current_input,name,filename,(ulong)__ptr->width,(ulong)__ptr->height,uVar18,uVar19);
LAB_001062fc:
  exit(1);
}

Assistant:

static void
anm_replace(
    const anm_archive_t* anm,
    FILE* anmfp,
    const char* name,
    const char* filename)
{
    const format_t formats[] = {
        FORMAT_RGBA8888,
        FORMAT_BGRA8888,
        FORMAT_RGB565,
        FORMAT_ARGB4444,
        FORMAT_GRAY8
    };
    unsigned int f;
    unsigned int width = 0;
    unsigned int height = 0;
    image_t* image;

    util_total_entry_size(anm, name, &width, &height);
    if (width == 0 || height == 0) {
        /* There's nothing to do. */
        return;
    }

    image = png_read(filename);

    if (width != image->width || height != image->height) {
        fprintf(stderr,
            "%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",
            argv0, current_input, name, filename, image->width, image->height,
            width, height);
        exit(1);
    }

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {

        long offset = 0;
        anm_entry_t* entry;
        list_for_each(&anm->entries, entry) {
            if (entry->name == name &&
                entry->thtx->format == formats[f] &&
                entry->header->hasdata) {
                unsigned int y;

                unsigned char* converted_data = format_from_rgba((uint32_t*)image->data, width * height, formats[f]);

                if (anmfp) {
                    for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                        if (!file_seek(anmfp,
                            offset + entry->header->thtxoffset + sizeof(thtx_header_t) + (y - entry->header->y) * entry->thtx->w * format_Bpp(formats[f])))
                            exit(1);
                        if (!file_write(anmfp, converted_data + y * width * format_Bpp(formats[f]) + entry->header->x * format_Bpp(formats[f]), entry->thtx->w * format_Bpp(formats[f])))
                            exit(1);
                    }
                } else {
                    for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                        memcpy(entry->data + (y - entry->header->y) * entry->thtx->w * format_Bpp(formats[f]),
                               converted_data + y * width * format_Bpp(formats[f]) + entry->header->x * format_Bpp(formats[f]),
                               entry->thtx->w * format_Bpp(formats[f]));
                    }
                }

                free(converted_data);
            }

            offset += entry->header->nextoffset;
        }
    }

    free(image->data);
    free(image);
}